

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeRCMSensorVariable(BerdyHelper *this,BerdySensorTypes sensorType)

{
  IndexRange IVar1;
  
  iDynTree::IndexRange::InvalidRange();
  if (sensorType != RCM_SENSOR) {
    iDynTree::reportWarning
              ("BerdyHelpers","getRangeRCMSensorVariable",
               "Wrong sensor types passed for retrieving sensor range");
  }
  if (1 < (this->m_options).berdyVariant - BERDY_FLOATING_BASE) {
    iDynTree::reportWarning
              ("BerdyHelpers","getRangeRCMSensorVariable",
               "Rate of Change of Momentum (RCM) sensor is only available in BERDY_FLOATING_BASE and BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES"
              );
  }
  IVar1.size = 6;
  IVar1.offset = (this->berdySensorTypeOffsets).rcmOffset;
  return IVar1;
}

Assistant:

IndexRange BerdyHelper::getRangeRCMSensorVariable(const BerdySensorTypes sensorType) const
{
    IndexRange ret = IndexRange::InvalidRange();

    if (sensorType != RCM_SENSOR)
    {
        iDynTree::reportWarning("BerdyHelpers","getRangeRCMSensorVariable","Wrong sensor types passed for retrieving sensor range");
    }

    if (m_options.berdyVariant != BERDY_FLOATING_BASE && m_options.berdyVariant != BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES )
    {
        iDynTree::reportWarning("BerdyHelpers","getRangeRCMSensorVariable","Rate of Change of Momentum (RCM) sensor is only available in BERDY_FLOATING_BASE and BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES");
    }

    // Set sensor size and offset
    ret.size = 6;
    ret.offset = berdySensorTypeOffsets.rcmOffset;

    assert(ret.isValid());
    return ret;
}